

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_narrow_op(TCGContext_conflict1 *tcg_ctx,int op,int u,int size,TCGv_i32 dest,
                       TCGv_i64 src)

{
  TCGv_i64 src_local;
  TCGv_i32 dest_local;
  int size_local;
  int u_local;
  int op_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (op == 0) {
    if (u == 0) {
      gen_neon_narrow_sats(tcg_ctx,size,dest,src);
    }
    else {
      gen_neon_narrow_satu(tcg_ctx,size,dest,src);
    }
  }
  else if (u == 0) {
    gen_neon_narrow(tcg_ctx,size,dest,src);
  }
  else {
    gen_neon_unarrow_sats(tcg_ctx,size,dest,src);
  }
  return;
}

Assistant:

static void gen_neon_narrow_op(TCGContext *tcg_ctx, int op, int u, int size,
                               TCGv_i32 dest, TCGv_i64 src)
{
    if (op) {
        if (u) {
            gen_neon_unarrow_sats(tcg_ctx, size, dest, src);
        } else {
            gen_neon_narrow(tcg_ctx, size, dest, src);
        }
    } else {
        if (u) {
            gen_neon_narrow_satu(tcg_ctx, size, dest, src);
        } else {
            gen_neon_narrow_sats(tcg_ctx, size, dest, src);
        }
    }
}